

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O3

int dlb_fclose(dlb *dp)

{
  int iVar1;
  
  if (dlb_initialized == '\0') {
    iVar1 = 0;
  }
  else {
    if ((FILE *)dp->fp == (FILE *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = fclose((FILE *)dp->fp);
    }
    free(dp);
  }
  return iVar1;
}

Assistant:

int dlb_fclose(dlb *dp)
{
	int ret = 0;

    if (dlb_initialized) {
	if (dp->fp) ret = fclose(dp->fp);
	else ret = do_dlb_fclose(dp);

	free(dp);
    }
    return ret;
}